

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O0

void generate_escaped_string(char *str,int length)

{
  size_t sVar1;
  ushort **ppuVar2;
  int local_18;
  int local_14;
  int i;
  int length_local;
  char *str_local;
  
  local_18 = 0;
  if ((length != 0) && (str != (char *)0x0)) {
    local_14 = length;
    if (length < 0) {
      sVar1 = strlen(str);
      local_14 = (int)sVar1;
    }
    for (; local_18 < local_14; local_18 = local_18 + 1) {
      switch(str[local_18]) {
      case '\a':
        printf("\\a");
        break;
      case '\b':
        printf("\\b");
        break;
      case '\t':
        printf("\\t");
        break;
      case '\n':
        printf("\\n");
        break;
      case '\v':
        printf("\\v");
        break;
      case '\f':
        printf("\\f");
        break;
      case '\r':
        printf("\\r");
        break;
      default:
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)str[local_18]] & 0x4000) == 0) {
          printf("\\%03o",(ulong)(byte)str[local_18]);
        }
        else {
          printf("%c",(ulong)(uint)(int)str[local_18]);
        }
        break;
      case '\x1b':
        printf("\\e");
        break;
      case '\"':
        printf("\\\"");
        break;
      case '\\':
        printf("\\\\");
      }
    }
  }
  return;
}

Assistant:

static void generate_escaped_string(const char *str, int length)
{
    int i = 0;

    if (length == 0 || str == NULL)
    {
        return;
    }

    if (length < 0)
    {
        length = (int)strlen(str);
    }

    while (i < length)
    {
        switch (str[i])
        {
            case '\033':       /* windows does not recognize '\e' */
                printf("\\e");
                break;
            case '\a':
                printf("\\a");
                break;
            case '\b':
                printf("\\b");
                break;
            case '\f':
                printf("\\f");
                break;
            case '\n':
                printf("\\n");
                break;
            case '\r':
                printf("\\r");
                break;
            case '\t':
                printf("\\t");
                break;
            case '\v':
                printf("\\v");
                break;
            case '\\':
                printf("\\\\");
                break;
            case '"':
                printf("\\\"");
                break;
            default:
                if (!isprint(str[i]))
                {
                    printf("\\%03o", (int)(unsigned char)str[i]);
                }
                else
                {
                    printf("%c", str[i]);
                }
                break;
        }
        i++;
    }
}